

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

bool check_reconnect(DESCRIPTOR_DATA *d,char *name,bool fConn)

{
  short *psVar1;
  CHAR_DATA *pCVar2;
  OBJ_DATA *pOVar3;
  bool bVar4;
  int min_level;
  char *pcVar5;
  OBJ_DATA **ppOVar6;
  CHAR_DATA **ch;
  CHAR_DATA *ch_00;
  char *bstr;
  string_view fmt;
  
  ch = &char_list;
  do {
    do {
      ch = &((CHAR_DATA *)ch)->next->next;
      if ((CHAR_DATA *)ch == (CHAR_DATA *)0x0) goto LAB_002d7bc6;
      bVar4 = is_npc((CHAR_DATA *)ch);
    } while ((bVar4) || ((fConn && (((CHAR_DATA *)ch)->desc != (DESCRIPTOR_DATA *)0x0))));
    pcVar5 = d->character->true_name;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = d->character->name;
    }
    bstr = ((CHAR_DATA *)ch)->true_name;
    if (bstr == (char *)0x0) {
      bstr = ((CHAR_DATA *)ch)->name;
    }
    bVar4 = str_cmp(pcVar5,bstr);
  } while (bVar4);
  pCVar2 = char_list;
  if (fConn) {
    while (ch_00 = pCVar2, ch_00 != (CHAR_DATA *)0x0) {
      pCVar2 = ch_00->next;
      bVar4 = is_npc(ch_00);
      if ((bVar4) &&
         (((bVar4 = is_affected(ch_00,(int)gsn_animate_dead), bVar4 ||
           (bVar4 = is_affected_by(ch_00,0x12), bVar4)) && (ch_00->master == d->character)))) {
        extract_char(ch_00,true);
      }
    }
    free_char(d->character);
    d->character = (CHAR_DATA *)ch;
    ((CHAR_DATA *)ch)->desc = d;
    ((CHAR_DATA *)ch)->timer = 0;
    send_to_char("Reconnecting. Type replay to see missed tells.\n\r",(CHAR_DATA *)ch);
    if (((CHAR_DATA *)ch)->invis_level < 0x33) {
      act("$n has reconnected.",(CHAR_DATA *)ch,(void *)0x0,(void *)0x0,0);
    }
    pcVar5 = palloc_string(((CHAR_DATA *)ch)->desc->host);
    ((CHAR_DATA *)ch)->pcdata->host = pcVar5;
    ppOVar6 = &((CHAR_DATA *)ch)->carrying;
    while (pOVar3 = *ppOVar6, pOVar3 != (OBJ_DATA *)0x0) {
      psVar1 = &pOVar3->pIndexData->limcount;
      *psVar1 = *psVar1 + 1;
      ppOVar6 = &pOVar3->next_content;
    }
    fmt._M_str = "{}@{} reconnected.";
    fmt._M_len = 0x12;
    CLogger::Info<char*&,char*&>((CLogger *)&RS.field_0x140,fmt,&((CHAR_DATA *)ch)->name,&d->host);
    min_level = get_trust((CHAR_DATA *)ch);
    wiznet("$N recovers from link death.",(CHAR_DATA *)ch,(OBJ_DATA *)0x0,4,0,min_level);
    d->connected = 0;
  }
  else {
    free_pstring(d->character->pcdata->pwd);
    pcVar5 = palloc_string(((CHAR_DATA *)ch)->pcdata->pwd);
    d->character->pcdata->pwd = pcVar5;
  }
LAB_002d7bc6:
  return (CHAR_DATA *)ch != (CHAR_DATA *)0x0;
}

Assistant:

bool check_reconnect(DESCRIPTOR_DATA *d, char *name, bool fConn)
{
	CHAR_DATA *ch, *fch, *fch_next;
	OBJ_DATA *obj;

	for (ch = char_list; ch != nullptr; ch = ch->next)
	{
		if (!is_npc(ch)
			&& (!fConn || ch->desc == nullptr)
			&& !str_cmp((d->character->true_name ? d->character->true_name : d->character->name), (ch->true_name ? ch->true_name : ch->name)))
		{
			if (fConn == false)
			{
				free_pstring(d->character->pcdata->pwd);
				d->character->pcdata->pwd = palloc_string(ch->pcdata->pwd);
			}
			else
			{
				for (fch = char_list; fch; fch = fch_next)
				{
					fch_next = fch->next;
					if (is_npc(fch)
						&& (is_affected(fch, gsn_animate_dead) || is_affected_by(fch, AFF_CHARM))
						&& fch->master == d->character)
					{
						extract_char(fch, true);
					}
				}

				free_char(d->character);
				d->character = ch;

				ch->desc = d;
				ch->timer = 0;

				send_to_char("Reconnecting. Type replay to see missed tells.\n\r", ch);

				if (ch->invis_level < 51)
					act("$n has reconnected.", ch, nullptr, nullptr, TO_ROOM);

				ch->pcdata->host = palloc_string(ch->desc->host);
				/* Limit crap to balance reconnect objects from extracted link object */
				for (obj = ch->carrying; obj != nullptr; obj = obj->next_content)
				{
					obj->pIndexData->limcount++;
				}

				RS.Logger.Info("{}@{} reconnected.", ch->name, d->host);

				wiznet("$N recovers from link death.", ch, nullptr, WIZ_LINKS, 0, get_trust(ch));
				d->connected = CON_PLAYING;
			}

			return true;
		}
	}

	return false;
}